

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-gtest-all.cpp
# Opt level: O1

void __thiscall testing::internal::ExpectationBase::RetireAllPreRequisites(ExpectationBase *this)

{
  ExpectationBase *this_00;
  _Rb_tree_node_base *p_Var1;
  
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  if (this->retired_ == false) {
    for (p_Var1 = (this->immediate_prerequisites_).expectations_._M_t._M_impl.super__Rb_tree_header.
                  _M_header._M_left;
        (_Rb_tree_header *)p_Var1 !=
        &(this->immediate_prerequisites_).expectations_._M_t._M_impl.super__Rb_tree_header;
        p_Var1 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var1)) {
      this_00 = *(ExpectationBase **)(p_Var1 + 1);
      MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
      if (this_00->retired_ == false) {
        RetireAllPreRequisites(this_00);
        MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
        this_00->retired_ = true;
      }
    }
  }
  return;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
  if (is_retired()) {
    // We can take this short-cut as we never retire an expectation
    // until we have retired all its pre-requisites.
    return;
  }

  for (ExpectationSet::const_iterator it = immediate_prerequisites_.begin();
       it != immediate_prerequisites_.end(); ++it) {
    ExpectationBase* const prerequisite = it->expectation_base().get();
    if (!prerequisite->is_retired()) {
      prerequisite->RetireAllPreRequisites();
      prerequisite->Retire();
    }
  }
}